

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkRevoluteTranslational::Initialize
          (ChLinkRevoluteTranslational *this,shared_ptr<chrono::ChBody> *body1,
          shared_ptr<chrono::ChBody> *body2,bool local,ChVector<double> *p1,ChVector<double> *dirZ1,
          ChVector<double> *p2,ChVector<double> *dirX2,ChVector<double> *dirY2,bool auto_distance,
          double distance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  element_type *peVar50;
  undefined1 auVar51 [16];
  bool bVar52;
  bool bVar53;
  int iVar54;
  int iVar55;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined7 in_register_00000009;
  ChBodyFrame *pCVar56;
  ChBodyFrame *pCVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  double dVar69;
  double dVar70;
  double dVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  double dVar130;
  double dVar131;
  double dVar132;
  undefined1 auVar133 [16];
  double local_48;
  double local_40;
  double local_38;
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  
  peVar50 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar57 = &peVar50->super_ChBodyFrame;
  if (peVar50 == (element_type *)0x0) {
    pCVar57 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar57;
  peVar50 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar56 = &peVar50->super_ChBodyFrame;
  if (peVar50 == (element_type *)0x0) {
    pCVar56 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar56;
  iVar54 = (*(pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar55 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_par1,(ChVariables *)CONCAT44(extraout_var,iVar54),
             (ChVariables *)CONCAT44(extraout_var_00,iVar55));
  iVar54 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  iVar55 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_par2,(ChVariables *)CONCAT44(extraout_var_01,iVar54),
             (ChVariables *)CONCAT44(extraout_var_02,iVar55));
  iVar54 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  iVar55 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_03,iVar54),
             (ChVariables *)CONCAT44(extraout_var_04,iVar55));
  iVar54 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  iVar55 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dist,(ChVariables *)CONCAT44(extraout_var_05,iVar54),
             (ChVariables *)CONCAT44(extraout_var_06,iVar55));
  if ((int)CONCAT71(in_register_00000009,local) == 0) {
    local_48 = p1->m_data[0];
    local_40 = p1->m_data[1];
    local_38 = p1->m_data[2];
    dVar130 = p2->m_data[0];
    dVar131 = p2->m_data[1];
    dVar132 = p2->m_data[2];
    dVar69 = dirZ1->m_data[0];
    auVar67._8_8_ = 0;
    auVar67._0_8_ = dVar69;
    dVar1 = dirZ1->m_data[1];
    dVar2 = dirZ1->m_data[2];
    auVar68._8_8_ = 0;
    auVar68._0_8_ = dVar2;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = dVar1 * dVar1;
    auVar58 = vfmadd231sd_fma(auVar58,auVar67,auVar67);
    auVar58 = vfmadd231sd_fma(auVar58,auVar68,auVar68);
    if (auVar58._0_8_ < 0.0) {
      auVar80._0_8_ = sqrt(auVar58._0_8_);
      auVar80._8_56_ = extraout_var_07;
      auVar58 = auVar80._0_16_;
    }
    else {
      auVar58 = vsqrtsd_avx(auVar58,auVar58);
    }
    bVar52 = 2.2250738585072014e-308 <= auVar58._0_8_;
    auVar58 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar58);
    dVar70 = auVar58._0_8_;
    dVar3 = dirX2->m_data[0];
    auVar114._8_8_ = 0;
    auVar114._0_8_ = dVar3;
    dVar4 = dirX2->m_data[1];
    dVar5 = dirX2->m_data[2];
    auVar125._8_8_ = 0;
    auVar125._0_8_ = dVar5;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = dVar4 * dVar4;
    auVar58 = vfmadd231sd_fma(auVar74,auVar114,auVar114);
    auVar58 = vfmadd231sd_fma(auVar58,auVar125,auVar125);
    if (auVar58._0_8_ < 0.0) {
      auVar81._0_8_ = sqrt(auVar58._0_8_);
      auVar81._8_56_ = extraout_var_08;
      auVar58 = auVar81._0_16_;
    }
    else {
      auVar58 = vsqrtsd_avx(auVar58,auVar58);
    }
    bVar53 = 2.2250738585072014e-308 <= auVar58._0_8_;
    auVar58 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar58);
    dVar71 = auVar58._0_8_;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = (ulong)bVar53 * (long)(dVar4 * dVar71);
    auVar61._0_8_ = (ulong)bVar53 * (long)(dVar3 * dVar71) + (ulong)!bVar53 * 0x3ff0000000000000;
    auVar61._8_8_ = 0;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = (ulong)bVar53 * (long)(dVar5 * dVar71);
    dVar3 = dirY2->m_data[0];
    auVar89._8_8_ = 0;
    auVar89._0_8_ = dVar3;
    dVar4 = dirY2->m_data[1];
    dVar5 = dirY2->m_data[2];
    auVar115._8_8_ = 0;
    auVar115._0_8_ = dVar5;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = dVar4 * dVar4;
    auVar58 = vfmadd231sd_fma(auVar76,auVar89,auVar89);
    auVar58 = vfmadd231sd_fma(auVar58,auVar115,auVar115);
    if (auVar58._0_8_ < 0.0) {
      auVar82._0_8_ = sqrt(auVar58._0_8_);
      auVar82._8_56_ = extraout_var_09;
      auVar58 = auVar82._0_16_;
    }
    else {
      auVar58 = vsqrtsd_avx(auVar58,auVar58);
    }
    auVar51._8_8_ = 0;
    auVar51._0_8_ = (ulong)bVar52 * (long)(dVar69 * dVar70) + (ulong)!bVar52 * 0x3ff0000000000000;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = (ulong)bVar52 * (long)(dVar1 * dVar70);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = (ulong)bVar52 * (long)(dVar2 * dVar70);
    bVar52 = 2.2250738585072014e-308 <= auVar58._0_8_;
    auVar58 = vdivsd_avx512f(ZEXT816(0x3ff0000000000000),auVar58);
    dVar69 = auVar58._0_8_;
    dVar4 = (double)((ulong)bVar52 * (long)(dVar4 * dVar69));
    auVar65._8_8_ = 0;
    auVar65._0_8_ = dVar4;
    auVar64._0_8_ = (ulong)bVar52 * (long)(dVar3 * dVar69) + (ulong)!bVar52 * 0x3ff0000000000000;
    auVar64._8_8_ = 0;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = (ulong)bVar52 * (long)(dVar5 * dVar69);
    pCVar57 = (this->super_ChLink).Body1;
    pCVar56 = (this->super_ChLink).Body2;
    dVar69 = local_38 -
             (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
    dVar1 = local_48 -
            (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
    dVar2 = local_40 -
            (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar103._8_8_ = 0;
    auVar103._0_8_ = dVar1;
    auVar118._8_8_ = 0;
    auVar118._0_8_ =
         dVar2 * (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar58 = vfmadd231sd_fma(auVar118,auVar103,auVar14);
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar93._8_8_ = 0;
    auVar93._0_8_ = dVar69;
    auVar58 = vfmadd231sd_fma(auVar58,auVar93,auVar15);
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar122._8_8_ = 0;
    auVar122._0_8_ =
         dVar2 * (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar67 = vfmadd231sd_fma(auVar122,auVar103,auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar67 = vfmadd231sd_fma(auVar67,auVar93,auVar17);
    auVar18._8_8_ = 0;
    auVar18._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar104._8_8_ = 0;
    auVar104._0_8_ = dVar1;
    auVar110._8_8_ = 0;
    auVar110._0_8_ =
         dVar2 * (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar68 = vfmadd231sd_fma(auVar110,auVar104,auVar18);
    auVar19._8_8_ = 0;
    auVar19._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar94._8_8_ = 0;
    auVar94._0_8_ = dVar69;
    auVar68 = vfmadd231sd_fma(auVar68,auVar94,auVar19);
    (this->m_p1).m_data[0] = auVar68._0_8_;
    (this->m_p1).m_data[1] = auVar67._0_8_;
    (this->m_p1).m_data[2] = auVar58._0_8_;
    dVar69 = dVar132 - (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data
                       [2];
    dVar1 = dVar130 - (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data
                      [0];
    dVar2 = dVar131 - (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data
                      [1];
    auVar20._8_8_ = 0;
    auVar20._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar105._8_8_ = 0;
    auVar105._0_8_ = dVar1;
    auVar119._8_8_ = 0;
    auVar119._0_8_ =
         dVar2 * (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar58 = vfmadd231sd_fma(auVar119,auVar105,auVar20);
    auVar21._8_8_ = 0;
    auVar21._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar95._8_8_ = 0;
    auVar95._0_8_ = dVar69;
    auVar58 = vfmadd231sd_fma(auVar58,auVar95,auVar21);
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar123._8_8_ = 0;
    auVar123._0_8_ =
         dVar2 * (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar67 = vfmadd231sd_fma(auVar123,auVar105,auVar22);
    auVar23._8_8_ = 0;
    auVar23._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar67 = vfmadd231sd_fma(auVar67,auVar95,auVar23);
    auVar24._8_8_ = 0;
    auVar24._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar106._8_8_ = 0;
    auVar106._0_8_ = dVar1;
    auVar111._8_8_ = 0;
    auVar111._0_8_ =
         dVar2 * (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar68 = vfmadd231sd_fma(auVar111,auVar106,auVar24);
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar96._8_8_ = 0;
    auVar96._0_8_ = dVar69;
    auVar68 = vfmadd231sd_fma(auVar68,auVar96,auVar25);
    (this->m_p2).m_data[0] = auVar68._0_8_;
    (this->m_p2).m_data[1] = auVar67._0_8_;
    (this->m_p2).m_data[2] = auVar58._0_8_;
    auVar26._8_8_ = 0;
    auVar26._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar58 = vmulsd_avx512f(auVar59,auVar26);
    auVar27._8_8_ = 0;
    auVar27._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar58 = vfmadd231sd_fma(auVar58,auVar51,auVar27);
    auVar28._8_8_ = 0;
    auVar28._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar67 = vfmadd231sd_avx512f(auVar58,auVar60,auVar28);
    auVar29._8_8_ = 0;
    auVar29._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar58 = vmulsd_avx512f(auVar59,auVar29);
    auVar30._8_8_ = 0;
    auVar30._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar58 = vfmadd231sd_fma(auVar58,auVar51,auVar30);
    auVar31._8_8_ = 0;
    auVar31._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar68 = vfmadd231sd_avx512f(auVar58,auVar60,auVar31);
    auVar32._8_8_ = 0;
    auVar32._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar58 = vmulsd_avx512f(auVar59,auVar32);
    auVar33._8_8_ = 0;
    auVar33._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar58 = vfmadd231sd_fma(auVar58,auVar51,auVar33);
    auVar34._8_8_ = 0;
    auVar34._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar58 = vfmadd231sd_avx512f(auVar58,auVar60,auVar34);
    (this->m_z1).m_data[0] = auVar58._0_8_;
    (this->m_z1).m_data[1] = auVar68._0_8_;
    (this->m_z1).m_data[2] = auVar67._0_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar58 = vmulsd_avx512f(auVar62,auVar35);
    auVar36._8_8_ = 0;
    auVar36._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar58 = vfmadd231sd_avx512f(auVar58,auVar61,auVar36);
    auVar37._8_8_ = 0;
    auVar37._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar58 = vfmadd231sd_avx512f(auVar58,auVar63,auVar37);
    auVar38._8_8_ = 0;
    auVar38._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar67 = vmulsd_avx512f(auVar62,auVar38);
    auVar39._8_8_ = 0;
    auVar39._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar67 = vfmadd231sd_avx512f(auVar67,auVar61,auVar39);
    auVar40._8_8_ = 0;
    auVar40._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar67 = vfmadd231sd_avx512f(auVar67,auVar63,auVar40);
    auVar41._8_8_ = 0;
    auVar41._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar68 = vmulsd_avx512f(auVar62,auVar41);
    auVar42._8_8_ = 0;
    auVar42._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar68 = vfmadd231sd_avx512f(auVar68,auVar61,auVar42);
    auVar43._8_8_ = 0;
    auVar43._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar68 = vfmadd231sd_avx512f(auVar68,auVar63,auVar43);
    (this->m_x2).m_data[0] = auVar68._0_8_;
    (this->m_x2).m_data[1] = auVar67._0_8_;
    (this->m_x2).m_data[2] = auVar58._0_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar97._8_8_ = 0;
    auVar97._0_8_ =
         dVar4 * (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
    auVar58 = vfmadd231sd_avx512f(auVar97,auVar64,auVar44);
    auVar45._8_8_ = 0;
    auVar45._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar58 = vfmadd231sd_fma(auVar58,auVar66,auVar45);
    auVar46._8_8_ = 0;
    auVar46._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar107._8_8_ = 0;
    auVar107._0_8_ =
         dVar4 * (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
    auVar67 = vfmadd231sd_avx512f(auVar107,auVar64,auVar46);
    auVar47._8_8_ = 0;
    auVar47._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar67 = vfmadd231sd_fma(auVar67,auVar66,auVar47);
    auVar48._8_8_ = 0;
    auVar48._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar112._8_8_ = 0;
    auVar112._0_8_ =
         dVar4 * (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
    auVar68 = vfmadd231sd_avx512f(auVar112,auVar64,auVar48);
    auVar49._8_8_ = 0;
    auVar49._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar68 = vfmadd231sd_fma(auVar68,auVar66,auVar49);
    (this->m_y2).m_data[0] = auVar68._0_8_;
    (this->m_y2).m_data[1] = auVar67._0_8_;
    (this->m_y2).m_data[2] = auVar58._0_8_;
  }
  else {
    if (&this->m_p1 != p1) {
      (this->m_p1).m_data[0] = p1->m_data[0];
      (this->m_p1).m_data[1] = p1->m_data[1];
      (this->m_p1).m_data[2] = p1->m_data[2];
    }
    if (&this->m_p2 != p2) {
      (this->m_p2).m_data[0] = p2->m_data[0];
      (this->m_p2).m_data[1] = p2->m_data[1];
      (this->m_p2).m_data[2] = p2->m_data[2];
    }
    dVar130 = dirZ1->m_data[0];
    auVar83._8_8_ = 0;
    auVar83._0_8_ = dVar130;
    dVar131 = dirZ1->m_data[1];
    dVar132 = dirZ1->m_data[2];
    auVar99._8_8_ = 0;
    auVar99._0_8_ = dVar132;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar131 * dVar131;
    auVar58 = vfmadd231sd_fma(auVar72,auVar83,auVar83);
    auVar58 = vfmadd231sd_fma(auVar58,auVar99,auVar99);
    if (auVar58._0_8_ < 0.0) {
      dVar69 = sqrt(auVar58._0_8_);
    }
    else {
      auVar58 = vsqrtsd_avx(auVar58,auVar58);
      dVar69 = auVar58._0_8_;
    }
    bVar52 = 2.2250738585072014e-308 <= dVar69;
    dVar69 = 1.0 / dVar69;
    (this->m_z1).m_data[0] =
         (double)((ulong)bVar52 * (long)(dVar130 * dVar69) + (ulong)!bVar52 * 0x3ff0000000000000);
    (this->m_z1).m_data[1] = (double)((ulong)bVar52 * (long)(dVar131 * dVar69));
    (this->m_z1).m_data[2] = (double)((ulong)bVar52 * (long)(dVar132 * dVar69));
    dVar130 = dirX2->m_data[0];
    auVar84._8_8_ = 0;
    auVar84._0_8_ = dVar130;
    dVar131 = dirX2->m_data[1];
    dVar132 = dirX2->m_data[2];
    auVar100._8_8_ = 0;
    auVar100._0_8_ = dVar132;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dVar131 * dVar131;
    auVar58 = vfmadd231sd_fma(auVar73,auVar84,auVar84);
    auVar58 = vfmadd231sd_fma(auVar58,auVar100,auVar100);
    if (auVar58._0_8_ < 0.0) {
      dVar69 = sqrt(auVar58._0_8_);
    }
    else {
      auVar58 = vsqrtsd_avx(auVar58,auVar58);
      dVar69 = auVar58._0_8_;
    }
    bVar52 = 2.2250738585072014e-308 <= dVar69;
    dVar69 = 1.0 / dVar69;
    (this->m_x2).m_data[0] =
         (double)((ulong)bVar52 * (long)(dVar130 * dVar69) + (ulong)!bVar52 * 0x3ff0000000000000);
    (this->m_x2).m_data[1] = (double)((ulong)bVar52 * (long)(dVar131 * dVar69));
    (this->m_x2).m_data[2] = (double)((ulong)bVar52 * (long)(dVar132 * dVar69));
    dVar130 = dirY2->m_data[0];
    auVar88._8_8_ = 0;
    auVar88._0_8_ = dVar130;
    dVar131 = dirY2->m_data[1];
    dVar132 = dirY2->m_data[2];
    auVar120._8_8_ = 0;
    auVar120._0_8_ = dVar132;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = dVar131 * dVar131;
    auVar58 = vfmadd231sd_fma(auVar75,auVar88,auVar88);
    auVar58 = vfmadd231sd_fma(auVar58,auVar120,auVar120);
    if (auVar58._0_8_ < 0.0) {
      dVar69 = sqrt(auVar58._0_8_);
    }
    else {
      auVar58 = vsqrtsd_avx(auVar58,auVar58);
      dVar69 = auVar58._0_8_;
    }
    bVar52 = 2.2250738585072014e-308 <= dVar69;
    dVar69 = 1.0 / dVar69;
    (this->m_y2).m_data[0] =
         (double)((ulong)bVar52 * (long)(dVar130 * dVar69) + (ulong)!bVar52 * 0x3ff0000000000000);
    (this->m_y2).m_data[1] = (double)((ulong)bVar52 * (long)(dVar131 * dVar69));
    (this->m_y2).m_data[2] = (double)((ulong)bVar52 * (long)(dVar132 * dVar69));
    pCVar57 = (this->super_ChLink).Body1;
    ChTransform<double>::TransformLocalToParent
              (&this->m_p1,&(pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
               &(pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
    pCVar57 = (this->super_ChLink).Body2;
    ChTransform<double>::TransformLocalToParent
              (&this->m_p2,&(pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
               &(pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
    auVar77._8_8_ = 0;
    auVar77._0_8_ = (this->m_z1).m_data[0];
    dVar130 = (this->m_z1).m_data[1];
    auVar85._8_8_ = 0;
    auVar85._0_8_ = dVar130;
    pCVar57 = (this->super_ChLink).Body1;
    pCVar56 = (this->super_ChLink).Body2;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar133._8_8_ = 0;
    auVar133._0_8_ =
         dVar130 * (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
    auVar58 = vfmadd231sd_fma(auVar133,auVar77,auVar6);
    auVar90._8_8_ = 0;
    auVar90._0_8_ = (this->m_z1).m_data[2];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar51 = vfmadd231sd_fma(auVar58,auVar90,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
    auVar58 = vmulsd_avx512f(auVar85,auVar8);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
    auVar58 = vfmadd231sd_avx512f(auVar58,auVar77,auVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar59 = vfmadd231sd_avx512f(auVar58,auVar90,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar58 = vmulsd_avx512f(auVar85,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar58 = vfmadd231sd_avx512f(auVar58,auVar77,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         (pCVar57->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar60 = vfmadd231sd_avx512f(auVar58,auVar90,auVar13);
    auVar78._8_8_ = 0;
    auVar78._0_8_ = (this->m_x2).m_data[0];
    auVar86._8_8_ = 0;
    auVar86._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar91._8_8_ = 0;
    auVar91._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar101._8_8_ = 0;
    auVar101._0_8_ = (this->m_x2).m_data[1];
    auVar58 = vmulsd_avx512f(auVar91,auVar101);
    auVar58 = vfmadd231sd_avx512f(auVar58,auVar86,auVar78);
    auVar109._8_8_ = 0;
    auVar109._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar116._8_8_ = 0;
    auVar116._0_8_ = (this->m_x2).m_data[2];
    auVar61 = vfmadd231sd_avx512f(auVar58,auVar109,auVar116);
    auVar121._8_8_ = 0;
    auVar121._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    dVar130 = (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
              super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
    ;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = dVar130;
    auVar58 = vmulsd_avx512f(auVar101,auVar124);
    auVar58 = vfmadd231sd_avx512f(auVar58,auVar121,auVar78);
    auVar126._8_8_ = 0;
    auVar126._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar62 = vfmadd231sd_avx512f(auVar58,auVar126,auVar116);
    auVar127._8_8_ = 0;
    auVar127._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    dVar131 = (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
              super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
    ;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = dVar131;
    auVar58 = vmulsd_avx512f(auVar101,auVar128);
    auVar58 = vfmadd231sd_avx512f(auVar58,auVar127,auVar78);
    auVar102._8_8_ = 0;
    auVar102._0_8_ =
         (pCVar56->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar63 = vfmadd231sd_avx512f(auVar58,auVar102,auVar116);
    auVar117._8_8_ = 0;
    auVar117._0_8_ = (this->m_y2).m_data[0];
    dVar132 = (this->m_y2).m_data[1];
    auVar129._8_8_ = 0;
    auVar129._0_8_ = dVar132;
    auVar58 = vmulsd_avx512f(auVar91,auVar129);
    auVar58 = vfmadd231sd_avx512f(auVar58,auVar117,auVar86);
    auVar92._8_8_ = 0;
    auVar92._0_8_ = (this->m_y2).m_data[2];
    auVar64 = vfmadd231sd_avx512f(auVar58,auVar92,auVar109);
    auVar79._8_8_ = 0;
    auVar79._0_8_ = dVar132 * dVar130;
    auVar58 = vfmadd231sd_fma(auVar79,auVar117,auVar121);
    auVar65 = vfmadd231sd_fma(auVar58,auVar92,auVar126);
    auVar87._8_8_ = 0;
    auVar87._0_8_ = dVar131 * dVar132;
    auVar58 = vfmadd231sd_fma(auVar87,auVar127,auVar117);
    auVar66 = vfmadd231sd_fma(auVar58,auVar102,auVar92);
    dVar132 = local_38;
    dVar131 = local_40;
    dVar130 = local_48;
  }
  auVar58 = vmulsd_avx512f(auVar62,auVar59);
  auVar58 = vfmadd231sd_avx512f(auVar58,auVar51,auVar61);
  auVar58 = vfmadd231sd_avx512f(auVar58,auVar60,auVar63);
  this->m_cur_par1 = auVar58._0_8_;
  auVar58 = vmulsd_avx512f(auVar65,auVar59);
  auVar58 = vfmadd231sd_avx512f(auVar58,auVar51,auVar64);
  auVar58 = vfmadd231sd_avx512f(auVar58,auVar60,auVar66);
  this->m_cur_par2 = auVar58._0_8_;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar131 - local_40;
  auVar58 = vmulsd_avx512f(auVar59,auVar108);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = dVar130 - local_48;
  auVar58 = vfmadd231sd_fma(auVar58,auVar113,auVar51);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar132 - local_38;
  auVar58 = vfmadd231sd_avx512f(auVar58,auVar98,auVar60);
  this->m_cur_dot = auVar58._0_8_;
  auVar58 = vmulsd_avx512f(auVar62,auVar108);
  auVar58 = vfmadd231sd_avx512f(auVar58,auVar113,auVar61);
  auVar58 = vfmadd231sd_avx512f(auVar58,auVar98,auVar63);
  this->m_cur_dist = auVar58._0_8_;
  this->m_dist = (double)((ulong)auto_distance * (long)auVar58._0_8_ +
                         (ulong)!auto_distance * (long)distance);
  return;
}

Assistant:

void ChLinkRevoluteTranslational::Initialize(std::shared_ptr<ChBody> body1,
                                             std::shared_ptr<ChBody> body2,
                                             bool local,
                                             const ChVector<>& p1,
                                             const ChVector<>& dirZ1,
                                             const ChVector<>& p2,
                                             const ChVector<>& dirX2,
                                             const ChVector<>& dirY2,
                                             bool auto_distance,
                                             double distance) {
    Body1 = body1.get();
    Body2 = body2.get();

    m_cnstr_par1.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_par2.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dot.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dist.SetVariables(&Body1->Variables(), &Body2->Variables());

    ChVector<> p1_abs;
    ChVector<> p2_abs;
    ChVector<> z1_abs;
    ChVector<> x2_abs;
    ChVector<> y2_abs;

    if (local) {
        m_p1 = p1;
        m_p2 = p2;
        m_z1 = Vnorm(dirZ1);
        m_x2 = Vnorm(dirX2);
        m_y2 = Vnorm(dirY2);
        p1_abs = Body1->TransformPointLocalToParent(m_p1);
        p2_abs = Body2->TransformPointLocalToParent(m_p2);
        z1_abs = Body1->TransformDirectionLocalToParent(m_z1);
        x2_abs = Body2->TransformDirectionLocalToParent(m_x2);
        y2_abs = Body2->TransformDirectionLocalToParent(m_y2);
    } else {
        p1_abs = p1;
        p2_abs = p2;
        z1_abs = Vnorm(dirZ1);
        x2_abs = Vnorm(dirX2);
        y2_abs = Vnorm(dirY2);
        m_p1 = Body1->TransformPointParentToLocal(p1_abs);
        m_p2 = Body2->TransformPointParentToLocal(p2_abs);
        m_z1 = Body1->TransformDirectionParentToLocal(z1_abs);
        m_x2 = Body2->TransformDirectionParentToLocal(x2_abs);
        m_y2 = Body2->TransformDirectionParentToLocal(y2_abs);
    }

    ChVector<> d12_abs = p2_abs - p1_abs;

    m_cur_par1 = Vdot(z1_abs, x2_abs);
    m_cur_par2 = Vdot(z1_abs, y2_abs);
    m_cur_dot = Vdot(d12_abs, z1_abs);
    m_cur_dist = Vdot(d12_abs, x2_abs);

    m_dist = auto_distance ? m_cur_dist : distance;
}